

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O0

int vkt::shaderexecutor::anon_unknown_0::findMSB(deInt32 value)

{
  undefined4 local_c;
  deInt32 value_local;
  
  if (value < 1) {
    if (value < 0) {
      local_c = deClz32(value ^ 0xffffffff);
      local_c = 0x1f - local_c;
    }
    else {
      local_c = -1;
    }
  }
  else {
    local_c = deClz32(value);
    local_c = 0x1f - local_c;
  }
  return local_c;
}

Assistant:

static int findMSB (deInt32 value)
{
	if (value > 0)
		return 31 - deClz32((deUint32)value);
	else if (value < 0)
		return 31 - deClz32(~(deUint32)value);
	else
		return -1;
}